

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void VW::empty_example(vw *param_1,example *ec)

{
  byte *pbVar1;
  example *__range1;
  byte *pbVar2;
  
  pbVar1 = (ec->super_example_predict).indices._end;
  for (pbVar2 = (ec->super_example_predict).indices._begin; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    features::clear((ec->super_example_predict).feature_space + *pbVar2);
  }
  v_array<unsigned_char>::clear((v_array<unsigned_char> *)ec);
  v_array<char>::clear(&ec->tag);
  ec->end_pass = false;
  ec->sorted = false;
  return;
}

Assistant:

void empty_example(vw& /* all */, example& ec)
{
  for (features& fs : ec) fs.clear();

  ec.indices.clear();
  ec.tag.clear();
  ec.sorted = false;
  ec.end_pass = false;
}